

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_mark_n(REF_SHARD ref_shard,REF_INT *face_marks,REF_INT *hex_marks)

{
  REF_STATUS RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL marked13;
  REF_BOOL marked02;
  REF_BOOL marked25;
  REF_BOOL marked16;
  REF_BOOL marked05;
  REF_BOOL marked14;
  REF_INT hex_nodes [27];
  int local_30;
  int local_2c;
  REF_INT cell;
  REF_INT face;
  REF_INT *hex_marks_local;
  REF_INT *face_marks_local;
  REF_SHARD ref_shard_local;
  
  *face_marks = 0;
  for (local_2c = 0; local_2c < ref_shard->face->n; local_2c = local_2c + 1) {
    if (ref_shard->mark[local_2c] != 0) {
      *face_marks = *face_marks + 1;
    }
  }
  *hex_marks = 0;
  local_30 = 0;
  do {
    if (ref_shard->grid->cell[0xb]->max <= local_30) {
      return 0;
    }
    RVar1 = ref_cell_nodes(ref_shard->grid->cell[0xb],local_30,&marked05);
    if (RVar1 == 0) {
      uVar2 = ref_shard_marked(ref_shard,marked14,hex_nodes[2],&marked16);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x8c,"ref_shard_mark_n",(ulong)uVar2,"1-4");
        return uVar2;
      }
      uVar2 = ref_shard_marked(ref_shard,marked05,hex_nodes[3],&marked25);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x8e,"ref_shard_mark_n",(ulong)uVar2,"0-5");
        return uVar2;
      }
      if ((marked16 != 0) || (marked25 != 0)) {
        *hex_marks = *hex_marks + 1;
      }
      uVar2 = ref_shard_marked(ref_shard,marked14,hex_nodes[4],&marked02);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x93,"ref_shard_mark_n",(ulong)uVar2,"1-6");
        return uVar2;
      }
      uVar2 = ref_shard_marked(ref_shard,hex_nodes[0],hex_nodes[3],&marked13);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x95,"ref_shard_mark_n",(ulong)uVar2,"2-5");
        return uVar2;
      }
      if ((marked02 != 0) || (marked13 != 0)) {
        *hex_marks = *hex_marks + 1;
      }
      uVar2 = ref_shard_marked(ref_shard,marked05,hex_nodes[0],&ref_private_macro_code_rss);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x9a,"ref_shard_mark_n",(ulong)uVar2,"0-2");
        return uVar2;
      }
      uVar2 = ref_shard_marked(ref_shard,marked14,hex_nodes[1],&ref_private_macro_code_rss_1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x9c,"ref_shard_mark_n",(ulong)uVar2,"1-3");
        return uVar2;
      }
      if ((ref_private_macro_code_rss != 0) || (ref_private_macro_code_rss_1 != 0)) {
        *hex_marks = *hex_marks + 1;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_n(REF_SHARD ref_shard, REF_INT *face_marks,
                                    REF_INT *hex_marks) {
  REF_INT face;
  REF_INT cell, hex_nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL marked14, marked05;
  REF_BOOL marked16, marked25;
  REF_BOOL marked02, marked13;

  (*face_marks) = 0;

  for (face = 0; face < ref_face_n(ref_shard_face(ref_shard)); face++)
    if (0 != ref_shard_mark(ref_shard, face)) (*face_marks)++;

  (*hex_marks) = 0;
  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_shard_grid(ref_shard)),
                                      cell, hex_nodes) {
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[4], &marked14),
        "1-4");
    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[5], &marked05),
        "0-5");

    if (marked14 || marked05) (*hex_marks)++;

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[6], &marked16),
        "1-6");
    RSS(ref_shard_marked(ref_shard, hex_nodes[2], hex_nodes[5], &marked25),
        "2-5");

    if (marked16 || marked25) (*hex_marks)++;

    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[2], &marked02),
        "0-2");
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[3], &marked13),
        "1-3");

    if (marked02 || marked13) (*hex_marks)++;
  }

  return REF_SUCCESS;
}